

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O1

void __thiscall
BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
::erase_node(BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
             *this)

{
  pointer plVar1;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *this_00;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  **ppBVar2;
  size_t index;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  pointer local_68;
  pointer plStack_60;
  pointer local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this->next = (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                *)0x0;
  this->data_size = 0;
  this->subset_size = 0;
  index = 0;
  do {
    if (index != 3) {
      local_48 = 0;
      local_40[0] = 0;
      local_88[0] = local_78;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>((string *)local_88,local_40,local_40);
      local_68 = (pointer)0x0;
      plStack_60 = (pointer)0x0;
      local_58 = (pointer)0x0;
      this_00 = b_array::
                Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                ::operator[](&this->data,index);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_88);
      plVar1 = (this_00->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this_00->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start = local_68;
      (this_00->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish = plStack_60;
      (this_00->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_58;
      local_68 = (pointer)0x0;
      plStack_60 = (pointer)0x0;
      local_58 = (pointer)0x0;
      if (plVar1 != (pointer)0x0) {
        operator_delete(plVar1);
      }
      if (local_68 != (pointer)0x0) {
        operator_delete(local_68);
      }
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
    }
    ppBVar2 = b_array::
              Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
              ::operator[](&this->subset,index);
    *ppBVar2 = (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                *)0x0;
    index = index + 1;
  } while (index != 4);
  return;
}

Assistant:

void BPlusTree<T>::erase_node() {
    data_size = 0;
    next = nullptr;
    subset_size = 0;
    // null out the subset array before it causes problems
    for (size_t i = 0; i < SUBSET_CAPACITY; ++i) {
        if (i < DATA_CAPACITY)
            data[i] = T();
        subset[i] = nullptr;
    }
}